

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_parentlessUsingRemoveUnits_Test::~Units_parentlessUsingRemoveUnits_Test
          (Units_parentlessUsingRemoveUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, parentlessUsingRemoveUnits)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("I_am_a_model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");

    model->addUnits(u);
    EXPECT_TRUE(u->hasParent());

    model->removeUnits(0);
    EXPECT_FALSE(u->hasParent());

    model->addUnits(u);
    EXPECT_TRUE(u->hasParent());

    model->removeUnits("u");
    EXPECT_FALSE(u->hasParent());

    model->addUnits(u);
    EXPECT_TRUE(u->hasParent());

    model->removeUnits(u);
    EXPECT_FALSE(u->hasParent());
}